

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

ScenarioLowerBound * __thiscall
despot::Adventurer::CreateScenarioLowerBound
          (Adventurer *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  MajorityActionPolicy *this_00;
  ParticleLowerBound *pPVar3;
  TrivialParticleLowerBound *this_01;
  ostream *poVar4;
  long *plVar5;
  long *plVar6;
  long *local_108 [2];
  long local_f8 [2];
  string local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 == 0) {
    this_01 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_01,(DSPOMDP *)this);
    return (ScenarioLowerBound *)this_01;
  }
  iVar2 = std::__cxx11::string::compare((char *)name);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)) {
    this_00 = (MajorityActionPolicy *)operator_new(0x28);
    plVar6 = local_38;
    pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
    local_48[0] = plVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
    pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_48);
    despot::BlindPolicy::BlindPolicy((BlindPolicy *)this_00,(DSPOMDP *)this,0,pPVar3);
    plVar5 = local_48[0];
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      this_00 = (MajorityActionPolicy *)operator_new(0x28);
      plVar6 = local_58;
      pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
      local_68[0] = plVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
      pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_68);
      despot::DefaultPolicy::DefaultPolicy((DefaultPolicy *)this_00,(DSPOMDP *)this,pPVar3);
      *(undefined ***)this_00 = &PTR__DefaultPolicy_00113c18;
      *(Adventurer **)((DefaultPolicy *)this_00 + 0x20) = this;
      plVar5 = local_68[0];
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        this_00 = (MajorityActionPolicy *)operator_new(0x38);
        plVar6 = local_78;
        pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
        local_88[0] = plVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
        pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_88);
        despot::RandomPolicy::RandomPolicy((RandomPolicy *)this_00,(DSPOMDP *)this,pPVar3);
        plVar5 = local_88[0];
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MDP","");
          ComputeDefaultActions(this,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          this_00 = (MajorityActionPolicy *)operator_new(0x48);
          plVar6 = local_b8;
          pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
          local_c8[0] = plVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
          pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_c8);
          despot::ModeStatePolicy::ModeStatePolicy
                    ((ModeStatePolicy *)this_00,(DSPOMDP *)this,&this->super_StateIndexer,
                     &this->super_StatePolicy,pPVar3);
          plVar5 = local_c8[0];
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 != 0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ");
            poVar4 = std::operator<<(poVar4,(string *)name);
            std::endl<char,std::char_traits<char>>(poVar4);
            exit(-1);
          }
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MDP","");
          ComputeDefaultActions(this,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          this_00 = (MajorityActionPolicy *)operator_new(0x28);
          plVar6 = local_f8;
          pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
          local_108[0] = plVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_108,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
          pPVar3 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_108);
          despot::MajorityActionPolicy::MajorityActionPolicy
                    (this_00,(DSPOMDP *)this,&this->super_StatePolicy,pPVar3);
          plVar5 = local_108[0];
        }
      }
    }
  }
  if (plVar5 != plVar6) {
    operator_delete(plVar5,*plVar6 + 1);
  }
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* Adventurer::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "STAY" || name == "DEFAULT") {
		return new BlindPolicy(model, A_STAY,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SMART") {
		return new AdventurerSmartPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY") {
		// ComputeDefaultActions(Globals::config.default_action);
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(-1);
		return NULL;
	}
}